

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

bool __thiscall argo::json::operator!=(json *this,string *s)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  bool bVar4;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  psVar3 = operator_cast_to_string_(this);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + psVar3->_M_string_length);
  bVar4 = true;
  if (local_38 == s->_M_string_length) {
    if (local_38 == 0) {
      bVar4 = false;
    }
    else {
      iVar2 = bcmp(local_40,(s->_M_dataplus)._M_p,local_38);
      bVar4 = iVar2 != 0;
    }
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return bVar4;
}

Assistant:

bool json::operator!=(const std::string &s) const
{
    return static_cast<string>(*this) != s;
}